

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

bool __thiscall
picojson::default_parse_context::
parse_array_item<std::istreambuf_iterator<char,std::char_traits<char>>>
          (default_parse_context *this,
          input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *in,size_t param_2)

{
  bool bVar1;
  array *this_00;
  default_parse_context local_30;
  default_parse_context ctx;
  
  this_00 = value::get<std::vector<picojson::value,std::allocator<picojson::value>>>(this->out_);
  local_30.out_ = (value *)((ulong)local_30.out_._4_4_ << 0x20);
  std::vector<picojson::value,_std::allocator<picojson::value>_>::emplace_back<picojson::value>
            (this_00,(value *)&stack0xffffffffffffffd0);
  value::~value((value *)&stack0xffffffffffffffd0);
  local_30.out_ =
       (this_00->super__Vector_base<picojson::value,_std::allocator<picojson::value>_>)._M_impl.
       super__Vector_impl_data._M_finish + -1;
  bVar1 = _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                    (&stack0xffffffffffffffd0,in);
  return bVar1;
}

Assistant:

bool parse_array_item(input<Iter>& in, size_t) {
      array& a = out_->get<array>();
      a.push_back(value());
      default_parse_context ctx(&a.back());
      return _parse(ctx, in);
    }